

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O3

int run_ipc_send_recv_pipe(int inprocess)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  ctx.expected_type = UV_NAMED_PIPE;
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&ctx.send.pipe,1);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&ctx.send.pipe,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_001a4b23;
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&ctx.send2.pipe,1);
    if (iVar1 != 0) goto LAB_001a4b30;
    iVar1 = uv_pipe_bind(&ctx.send2.pipe,"/tmp/uv-test-sock2");
    if (iVar1 == 0) {
      run_test(inprocess);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return extraout_EAX;
      }
      goto LAB_001a4b57;
    }
  }
  else {
    run_ipc_send_recv_pipe_cold_1();
LAB_001a4b23:
    run_ipc_send_recv_pipe_cold_2();
LAB_001a4b30:
    run_ipc_send_recv_pipe_cold_3();
  }
  run_ipc_send_recv_pipe_cold_4();
  run_ipc_send_recv_pipe_cold_5();
LAB_001a4b57:
  run_ipc_send_recv_pipe_cold_6();
  run_ipc_send_recv_pipe(1);
  return 0;
}

Assistant:

static int run_ipc_send_recv_pipe(int inprocess) {
  int r;

  ctx.expected_type = UV_NAMED_PIPE;

  r = uv_pipe_init(uv_default_loop(), &ctx.send.pipe, 1);
  ASSERT_OK(r);

  r = uv_pipe_bind(&ctx.send.pipe, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_pipe_init(uv_default_loop(), &ctx.send2.pipe, 1);
  ASSERT_OK(r);

  r = uv_pipe_bind(&ctx.send2.pipe, TEST_PIPENAME_2);
  ASSERT_OK(r);

  r = run_test(inprocess);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}